

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ErrorFinish(sqlite3 *db,int err_code)

{
  if (db->pErr != (Mem *)0x0) {
    sqlite3VdbeMemSetNull(db->pErr);
  }
  sqlite3SystemError(db,err_code);
  return;
}

Assistant:

static SQLITE_NOINLINE void  sqlite3ErrorFinish(sqlite3 *db, int err_code){
  if( db->pErr ) sqlite3ValueSetNull(db->pErr);
  sqlite3SystemError(db, err_code);
}